

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_global_t * wasm_global_new(wasm_store_t *store,wasm_globaltype_t *type,wasm_val_t *val)

{
  FILE *__stream;
  wasm_global_t *this;
  GlobalType *pGVar1;
  TypedValue *tv;
  undefined8 in_R9;
  Value value_00;
  undefined **local_90;
  ExternKind local_88;
  undefined8 local_84;
  Ptr local_78;
  TypedValue value;
  string local_48;
  
  if ((store != (wasm_store_t *)0x0) && (type != (wasm_globaltype_t *)0x0)) {
    ToWabtValue(&value,val);
    __stream = _stderr;
    wabt::interp::TypedValueToString_abi_cxx11_(&local_48,(interp *)&value,tv);
    fprintf(__stream,"CAPI: [%s] %s\n","wasm_global_new",local_48._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    this = (wasm_global_t *)operator_new(0x18);
    pGVar1 = wasm_externtype_t::As<wabt::interp::GlobalType>(&type->super_wasm_externtype_t);
    local_88 = (pGVar1->super_ExternType).kind;
    local_90 = &PTR__ExternType_001f0960;
    local_84 = *(undefined8 *)&(pGVar1->super_ExternType).field_0xc;
    value_00._8_8_ = in_R9;
    value_00.i64_ = value.value._8_8_;
    wabt::interp::Global::New
              (&local_78,(Global *)store,(Store *)&local_90,(GlobalType *)value.value.i64_,value_00)
    ;
    wasm_global_t::wasm_global_t(this,&local_78);
    wabt::interp::RefPtr<wabt::interp::Global>::reset(&local_78);
    return this;
  }
  __assert_fail("store && type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x364,
                "wasm_global_t *wasm_global_new(wasm_store_t *, const wasm_globaltype_t *, const wasm_val_t *)"
               );
}

Assistant:

own wasm_global_t* wasm_global_new(wasm_store_t* store,
                                   const wasm_globaltype_t* type,
                                   const wasm_val_t* val) {
  assert(store && type);
  TypedValue value = ToWabtValue(*val);
  TRACE("%s", TypedValueToString(value).c_str());
  return new wasm_global_t{
      Global::New(store->I, *type->As<GlobalType>(), value.value)};
}